

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O3

void Inta_ManPrepareInter(Inta_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Sto_Cls_t *pSVar3;
  Aig_Man_t *p_00;
  Aig_Obj_t **ppAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *p1;
  uint i;
  ulong uVar7;
  
  for (pSVar3 = p->pCnf->pHead;
      (pSVar3 != (Sto_Cls_t *)0x0 && ((*(uint *)&pSVar3->field_0x1c & 2) != 0));
      pSVar3 = pSVar3->pNext) {
    pAVar6 = p->pAig->pConst1;
    if ((*(uint *)&pSVar3->field_0x1c & 1) == 0) {
      p->pInters[pSVar3->Id] = pAVar6;
    }
    else {
      p->pInters[pSVar3->Id] = (Aig_Obj_t *)((ulong)pAVar6 ^ 1);
      if ((*(uint *)&pSVar3->field_0x1c & 0x7fffff8) != 0) {
        uVar7 = 0;
        do {
          uVar1 = *(uint *)((long)&pSVar3[1].pNext + uVar7 * 4);
          if (p->pVarTypes[(int)uVar1 >> 1] < 0) {
            i = ~p->pVarTypes[(int)uVar1 >> 1];
            if (p->vVarsAB->nSize <= (int)i) {
              __assert_fail("VarAB >= 0 && VarAB < Vec_IntSize(p->vVarsAB)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                            ,0x397,"void Inta_ManPrepareInter(Inta_Man_t *)");
            }
            p_00 = p->pAig;
            ppAVar4 = p->pInters;
            iVar2 = pSVar3->Id;
            pAVar6 = ppAVar4[iVar2];
            pAVar5 = Aig_IthVar(p_00,i);
            p1 = (Aig_Obj_t *)((ulong)pAVar5 ^ 1);
            if ((uVar1 & 1) == 0) {
              p1 = pAVar5;
            }
            pAVar6 = Aig_Or(p_00,pAVar6,p1);
            ppAVar4[iVar2] = pAVar6;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < (*(uint *)&pSVar3->field_0x1c >> 3 & 0xffffff));
      }
    }
  }
  return;
}

Assistant:

void Inta_ManPrepareInter( Inta_Man_t * p )
{
    Sto_Cls_t * pClause;
    int Var, VarAB, v;

    // set interpolants for root clauses
    Sto_ManForEachClauseRoot( p->pCnf, pClause )
    {
        if ( !pClause->fA ) // clause of B
        {
            Inta_ManAigFill( p, Inta_ManAigRead(p, pClause) );
//            Inta_ManPrintInterOne( p, pClause );
            continue;
        }
        // clause of A
        Inta_ManAigClear( p, Inta_ManAigRead(p, pClause) );
        for ( v = 0; v < (int)pClause->nLits; v++ )
        {
            Var = lit_var(pClause->pLits[v]);
            if ( p->pVarTypes[Var] < 0 ) // global var
            {
                VarAB = -p->pVarTypes[Var]-1;
                assert( VarAB >= 0 && VarAB < Vec_IntSize(p->vVarsAB) );
                if ( lit_sign(pClause->pLits[v]) ) // negative var
                    Inta_ManAigOrNotVar( p, Inta_ManAigRead(p, pClause), VarAB );
                else
                    Inta_ManAigOrVar( p, Inta_ManAigRead(p, pClause), VarAB );
            }
        }
//        Inta_ManPrintInterOne( p, pClause );
    }
}